

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

char * checkedMalloc(size_t size)

{
  UtestShell *pUVar1;
  size_t in_RDI;
  char *mem;
  NormalTestTerminator *this;
  NormalTestTerminator local_18;
  char *local_10;
  
  local_10 = (char *)(*PlatformSpecificMalloc)(in_RDI);
  if (local_10 == (char *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    local_18.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    this = &local_18;
    NormalTestTerminator::NormalTestTerminator(this);
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"malloc returned null pointer",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x25,this);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1742ee);
  }
  return local_10;
}

Assistant:

static char* checkedMalloc(size_t size)
{
    char* mem = (char*) PlatformSpecificMalloc(size);
    if (mem == NULLPTR)
    FAIL("malloc returned null pointer");
    return mem;
}